

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityComponentStore.cpp
# Opt level: O2

void __thiscall EntityComponentStoreTests::Run(EntityComponentStoreTests *this)

{
  allocator local_2c9;
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  _Any_data local_168;
  code *local_158;
  code *local_150;
  _Any_data local_148;
  code *local_138;
  code *local_130;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  std::__cxx11::string::string
            (local_188,"an entity component store with added entities and with components",
             &local_2c9);
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:135:78)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:135:78)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[4])
            (this,local_188);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::string
            (local_1a8,"getting the string component of an entity gives the expected value",
             &local_2c9);
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:157:78)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:157:78)>
             ::_M_manager;
  local_48._M_unused._M_object = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_1a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::string
            (local_1c8,"getting the int component of an entity gives the expected value",&local_2c9)
  ;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:162:75)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:162:75)>
             ::_M_manager;
  local_68._M_unused._M_object = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_1c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::string
            (local_1e8,
             "getting a component of an entity that does not exist throws the expected exception",
             &local_2c9);
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:167:94)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:167:94)>
             ::_M_manager;
  local_88._M_unused._M_object = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_1e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::string
            (local_208,
             "getting a component of an entity that does not have that component throws the expected exception"
             ,&local_2c9);
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:171:108)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:171:108)>
             ::_M_manager;
  local_a8._M_unused._M_object = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_208);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::string(local_228,"getting all entities",&local_2c9);
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:175:32)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:175:32)>
             ::_M_manager;
  local_c8._M_unused._M_object = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[5])
            (this,local_228);
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::string(local_248,"the expected entities are returned",&local_2c9);
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:179:46)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:179:46)>
             ::_M_manager;
  local_e8._M_unused._M_object = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_248);
  std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::string(local_268,"getting all entities with string components",&local_2c9);
  local_108._8_8_ = 0;
  local_f0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:183:55)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:183:55)>
             ::_M_manager;
  local_108._M_unused._M_object = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[5])
            (this,local_268);
  std::_Function_base::~_Function_base((_Function_base *)&local_108);
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::string(local_288,"the expected entities are returned",&local_2c9);
  local_128._8_8_ = 0;
  local_110 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:187:46)>
              ::_M_invoke;
  local_118 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:187:46)>
              ::_M_manager;
  local_128._M_unused._M_object = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_288);
  std::_Function_base::~_Function_base((_Function_base *)&local_128);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::string::string(local_2a8,"getting all entities with int components",&local_2c9);
  local_148._8_8_ = 0;
  local_130 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:191:52)>
              ::_M_invoke;
  local_138 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:191:52)>
              ::_M_manager;
  local_148._M_unused._M_object = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[5])
            (this,local_2a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_148);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::string(local_2c8,"the expected entities are returned",&local_2c9);
  local_168._8_8_ = 0;
  local_150 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:195:46)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EntityComponentStore.cpp:195:46)>
              ::_M_manager;
  local_168._M_unused._M_object = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_2c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  std::__cxx11::string::~string(local_2c8);
  return;
}

Assistant:

virtual void Run()
	{
		Given("an entity component store with added entities and with components", [&]() 
		{
			m_entityComponentStore = ecs::EntityComponentStore<int>();
			m_actualEntities = std::vector<int>();

			m_entities = { 1, 2, 3, 4, 5 };
			for (auto entity : m_entities)
				m_entityComponentStore.addEntity(entity);

			m_entitiesWithStringComponent.push_back(m_entities[2]);
			m_entitiesWithIntComponent.push_back(m_entities[2]);
			m_entitiesWithIntComponent.push_back(m_entities[3]);

			m_expectedStringComponentValue = std::string("test_component1");
			m_expectedIntComponentValue = 7;

			for (auto entity : m_entitiesWithStringComponent)
				m_entityComponentStore.addComponent(entity, m_expectedStringComponentValue);

			for (auto entity : m_entitiesWithIntComponent)
				m_entityComponentStore.addComponent(entity, m_expectedIntComponentValue);
		});
		Then("getting the string component of an entity gives the expected value", [&]()
		{
			std::string component = m_entityComponentStore.getComponentOfEntity<std::string>(m_entitiesWithStringComponent[0]);
			AssertThat(component, ut11::Is::EqualTo(m_expectedStringComponentValue));
		});
		Then("getting the int component of an entity gives the expected value", [&]()
		{
			int component = m_entityComponentStore.getComponentOfEntity<int>(m_entitiesWithIntComponent[0]);
			AssertThat(component, ut11::Is::EqualTo(m_expectedIntComponentValue));
		});
		Then("getting a component of an entity that does not exist throws the expected exception", [&]()
		{
			AssertThat([&]() { m_entityComponentStore.getComponentOfEntity<std::string>(100); }, ut11::Will::Throw<ecs::EntityNotFoundException>());
		});
		Then("getting a component of an entity that does not have that component throws the expected exception", [&]()
		{
			AssertThat([&]() { m_entityComponentStore.getComponentOfEntity<std::string>(m_entities[4]); }, ut11::Will::Throw<ecs::ComponentNotFoundException>());
		});
		When("getting all entities", [&]() 
		{
			m_actualEntities = m_entityComponentStore.getAllEntities();
		});
		Then("the expected entities are returned", [&]() 
		{
			AssertThat(m_actualEntities, ut11::Is::Iterable::EquivalentTo(m_entities));
		});
		When("getting all entities with string components", [&]()
		{
			m_actualEntities = m_entityComponentStore.getAllEntitiesFor<std::string>();
		});
		Then("the expected entities are returned", [&]()
		{
			AssertThat(m_actualEntities, ut11::Is::Iterable::EquivalentTo(m_entitiesWithStringComponent));
		});
		When("getting all entities with int components", [&]()
		{
			m_actualEntities = m_entityComponentStore.getAllEntitiesFor<int>();
		});
		Then("the expected entities are returned", [&]()
		{
			AssertThat(m_actualEntities, ut11::Is::Iterable::EquivalentTo(m_entitiesWithIntComponent));
		});
	}